

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

bool __thiscall
ON_OffsetSurfaceFunction::EvaluateDistance
          (ON_OffsetSurfaceFunction *this,double s,double t,int num_der,double *value)

{
  int iVar1;
  int iVar2;
  ON_BumpFunction *this_00;
  double **local_110;
  int local_fc;
  int local_f8;
  int vi_1;
  int bump_index;
  int bump_count;
  double *bump_value;
  double barray [21];
  int local_38;
  bool rc;
  int vi;
  int vcnt;
  double *value_local;
  int num_der_local;
  double t_local;
  double s_local;
  ON_OffsetSurfaceFunction *this_local;
  
  iVar1 = ((num_der + 1) * (num_der + 2)) / 2;
  for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
    value[local_38] = 0.0;
  }
  barray[0x14]._7_1_ = Initialize(this);
  if ((bool)barray[0x14]._7_1_) {
    if (iVar1 < 0x16) {
      local_110 = &bump_value;
    }
    else {
      local_110 = (double **)onmalloc((long)iVar1 << 3);
    }
    iVar2 = ON_SimpleArray<ON_BumpFunction>::Count(&this->m_bumps);
    for (local_f8 = 0; local_f8 < iVar2; local_f8 = local_f8 + 1) {
      this_00 = ON_SimpleArray<ON_BumpFunction>::operator[](&this->m_bumps,local_f8);
      ON_BumpFunction::Evaluate(this_00,s,t,num_der,(double *)local_110);
      for (local_fc = 0; local_fc < iVar1; local_fc = local_fc + 1) {
        value[local_fc] = (double)local_110[local_fc] + value[local_fc];
      }
    }
    if (local_110 != &bump_value) {
      onfree(local_110);
    }
  }
  return (bool)(barray[0x14]._7_1_ & 1);
}

Assistant:

bool ON_OffsetSurfaceFunction::EvaluateDistance(
      double s,
      double t,
      int num_der,
      double* value
      ) const
{
  const int vcnt = ((num_der+1)*(num_der+2))/2;
  for ( int vi = 0; vi < vcnt; vi++ )
  {
    value[vi] = 0;
  }

  bool rc = const_cast<ON_OffsetSurfaceFunction*>(this)->Initialize();

  if (rc)
  {
    double barray[21];
    double* bump_value = (vcnt > 21)
                       ? (double*)onmalloc(vcnt*sizeof(bump_value[0]))
                       : barray;
    const int bump_count = m_bumps.Count();
    int bump_index;
    for ( bump_index = 0; bump_index < bump_count; bump_index++ )
    {
      m_bumps[bump_index].Evaluate( s, t, num_der, bump_value );
      for ( int vi = 0; vi < vcnt; vi++ )
      {
        value[vi] += bump_value[vi];
      }
    }
    if ( bump_value != barray )
      onfree(bump_value);
  }
  return rc;
}